

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

void __thiscall
DomStringPropertySpecification::~DomStringPropertySpecification
          (DomStringPropertySpecification *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_notr).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_type).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

DomStringPropertySpecification::~DomStringPropertySpecification() = default;